

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseCheckNondrivenNets(Vec_Ptr_t *vUndefs)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  Abc_Obj_t *pObj;
  char *pcVar5;
  int local_48;
  int local_44;
  int m;
  int j;
  int k;
  int i;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pBox;
  Ver_Bundle_t *pBundle;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vUndefs_local;
  
  j = 0;
  do {
    iVar1 = Vec_PtrSize(vUndefs);
    if (iVar1 <= j) {
      return 0;
    }
    pvVar2 = Vec_PtrEntry(vUndefs,j);
    for (m = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 0x158)), m < iVar1; m = m + 1) {
      pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 0x158),m);
      local_44 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar3 + 0x40));
      while (local_44 = local_44 + -1, -1 < local_44) {
        pvVar4 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar3 + 0x40),local_44);
        if (pvVar4 != (void *)0x0) {
          for (local_48 = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar4 + 8)),
              local_48 < iVar1; local_48 = local_48 + 1) {
            pObj = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar4 + 8),local_48);
            iVar1 = Abc_ObjFaninNum(pObj);
            if (iVar1 == 0) {
              pcVar5 = Abc_ObjName(pObj);
              iVar1 = strcmp(pcVar5,"1\'b0");
              if (iVar1 != 0) {
                pcVar5 = Abc_ObjName(pObj);
                iVar1 = strcmp(pcVar5,"1\'b1");
                if (iVar1 != 0) {
                  return 1;
                }
              }
            }
          }
        }
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

int Ver_ParseCheckNondrivenNets( Vec_Ptr_t * vUndefs )
{
    Abc_Ntk_t * pNtk;
    Ver_Bundle_t * pBundle;
    Abc_Obj_t * pBox, * pNet;
    int i, k, j, m;
    // go through undef box types
    Vec_PtrForEachEntry( Abc_Ntk_t *, vUndefs, pNtk, i )
        // go through instances of this type
        Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
            // go through the bundles of this instance
            Vec_PtrForEachEntryReverse( Ver_Bundle_t *, (Vec_Ptr_t *)pBox->pCopy, pBundle, j )
                // go through the actual nets of this bundle
                if ( pBundle )
                Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNet, m )
                {
                    if ( Abc_ObjFaninNum(pNet) == 0 ) // non-driven
                        if ( strcmp(Abc_ObjName(pNet), "1\'b0") && strcmp(Abc_ObjName(pNet), "1\'b1") ) // diff from a const
                            return 1;
                }
    return 0;
}